

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O0

fields absl::lts_20250127::time_internal::cctz::detail::impl::n_mon
                 (year_t y,diff_t m,diff_t d,diff_t cd,hour_t hh,minute_t mm,second_t ss)

{
  undefined1 auVar1 [13];
  fields fVar2;
  minute_t mm_local;
  hour_t hh_local;
  diff_t cd_local;
  diff_t d_local;
  diff_t m_local;
  year_t y_local;
  undefined3 uStack_b;
  
  d_local = m;
  m_local = y;
  if (m != 0xc) {
    m_local = m / 0xc + y;
    d_local = m % 0xc;
    if (d_local < 1) {
      m_local = m_local + -1;
      d_local = d_local + 0xc;
    }
  }
  fVar2 = n_day(m_local,(month_t)d_local,d,cd,hh,mm,ss);
  auVar1 = fVar2._0_13_;
  fVar2._13_3_ = uStack_b;
  fVar2.y = auVar1._0_8_;
  fVar2.m = auVar1[8];
  fVar2.d = auVar1[9];
  fVar2.hh = auVar1[10];
  fVar2.mm = auVar1[0xb];
  fVar2.ss = auVar1[0xc];
  return fVar2;
}

Assistant:

CONSTEXPR_F fields n_mon(year_t y, diff_t m, diff_t d, diff_t cd, hour_t hh,
                         minute_t mm, second_t ss) noexcept {
  if (m != 12) {
    y += m / 12;
    m %= 12;
    if (m <= 0) {
      y -= 1;
      m += 12;
    }
  }
  return n_day(y, static_cast<month_t>(m), d, cd, hh, mm, ss);
}